

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::BaseTag(BaseTag *this,string *params_file)

{
  char *pcVar1;
  istream local_230 [8];
  ifstream fin;
  string *params_file_local;
  BaseTag *this_local;
  
  MDP::MDP(&this->super_MDP);
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  StateIndexer::StateIndexer(&this->super_StateIndexer);
  StatePolicy::StatePolicy(&this->super_StatePolicy);
  MMAPInferencer::MMAPInferencer(&this->super_MMAPInferencer);
  *(undefined ***)this = &PTR__BaseTag_00159420;
  *(undefined ***)&this->super_BeliefMDP = &PTR__BaseTag_00159550;
  *(undefined ***)&this->super_StateIndexer = &PTR__BaseTag_00159658;
  *(undefined ***)&this->super_StatePolicy = &PTR__BaseTag_00159690;
  *(undefined ***)&this->super_MMAPInferencer = &PTR__BaseTag_001596b8;
  despot::Floor::Floor(&this->floor_);
  std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::vector(&this->states_);
  std::vector<int,_std::allocator<int>_>::vector(&this->rob_);
  std::vector<int,_std::allocator<int>_>::vector(&this->opp_);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::vector(&this->transition_probabilities_);
  MemoryPool<despot::TagState>::MemoryPool(&this->memory_pool_);
  std::vector<int,_std::allocator<int>_>::vector(&this->default_action_);
  this->robot_pos_unknown_ = false;
  current_ = this;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_230,pcVar1,_S_in);
  Init(this,local_230);
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

BaseTag::BaseTag(string params_file) :
  robot_pos_unknown_(false) {
	current_ = this;
	ifstream fin(params_file.c_str(), ifstream::in);
	Init(fin);
}